

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedCloseWebSocket::receive(DelayedCloseWebSocket *this)

{
  WebSocket *pWVar1;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar2;
  PropagateException local_30 [8];
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_28;
  DelayedCloseWebSocket *this_local;
  
  this_local = this;
  pWVar1 = Own<kj::WebSocket>::operator->((Own<kj::WebSocket> *)(in_RSI + 8));
  (*pWVar1->_vptr_WebSocket[6])();
  Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
  then<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::receive()::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *)this,
             (Type *)&local_28,local_30);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
            (&local_28);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
      return inner->receive().then([this](Message&& message) -> kj::Promise<Message> {
        if (message.is<WebSocket::Close>()) {
          return afterReceiveClosed()
              .then([message = kj::mv(message)]() mutable { return kj::mv(message); });
        }
        return kj::mv(message);
      });
    }